

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramLogCase::iterate(ProgramLogCase *this)

{
  ostringstream *this_00;
  TestLog *log;
  Context *this_01;
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint *code;
  long lVar3;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> logLen;
  ResultCollector result;
  ShaderProgram program;
  value_type local_4d0;
  undefined1 local_4b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  undefined1 local_460 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  string local_438;
  string local_418;
  undefined1 local_3f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  ProgramSources local_3a0;
  undefined1 local_2d0 [120];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_240;
  deUint32 local_228;
  undefined1 local_220 [24];
  bool local_208;
  ResultCollector local_150;
  ShaderProgram local_100;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,0x96985f);
  tcu::ResultCollector::ResultCollector(&local_150,log,(string *)local_2d0);
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_3f8,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_01 = (this->super_TestCase).m_context;
  renderCtx = this_01->m_renderCtx;
  code = &switchD_004e5a1a::switchdataD_0097816c;
  switch(this->m_buildErrorType) {
  case BUILDERROR_VERTEX_FRAGMENT:
    memset(local_2d0,0,0xac);
    local_220._0_8_ = (pointer)0x0;
    local_220[8] = 0;
    local_220._9_7_ = 0;
    local_220[0x10] = 0;
    stack0xfffffffffffffdf1 = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_488,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
               ,(char *)code);
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,CONCAT44(local_488._4_4_,local_488._0_4_),
               (char *)(local_488._8_8_ + CONCAT44(local_488._4_4_,local_488._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d0,&local_4d0);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_460,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
               ,(char *)code);
    local_4b0._0_4_ = 1;
    local_4b0._8_8_ = local_4a0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4b0 + 8),CONCAT44(local_460._4_4_,local_460._0_4_),
               (char *)(local_460._8_8_ + CONCAT44(local_460._4_4_,local_460._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + (ulong)(uint)local_4b0._0_4_ * 0x18),(value_type *)(local_4b0 + 8));
    lVar3 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_3a0.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_2d0 + lVar3));
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_3a0.attribLocationBindings,&vStack_240);
    local_3a0.transformFeedbackBufferMode = local_228;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_3a0.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_220);
    local_3a0.separable = local_208;
    if ((char *)local_4b0._8_8_ != local_4a0._M_local_buf + 8) {
      operator_delete((void *)local_4b0._8_8_,local_4a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_460._4_4_,local_460._0_4_) != &local_450) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_460._4_4_,local_460._0_4_),
                      local_450._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_488._4_4_,local_488._0_4_) != &local_478) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_488._4_4_,local_488._0_4_),
                      local_478._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_220);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&vStack_240);
    lVar3 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    break;
  case BUILDERROR_COMPUTE:
    memset(local_2d0,0,0xac);
    local_220._0_8_ = (pointer)0x0;
    local_220[8] = 0;
    local_220._9_7_ = 0;
    local_220[0x10] = 0;
    stack0xfffffffffffffdf1 = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_4b0,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout (binding = 0) buffer IOBuffer { highp float buf_var; };\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tbuf_var = u_uniform.x;\n}\n"
               ,(char *)code);
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,CONCAT44(local_4b0._4_4_,local_4b0._0_4_),
               (char *)(local_4b0._8_8_ + CONCAT44(local_4b0._4_4_,local_4b0._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_258,&local_4d0);
    lVar3 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_3a0.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_2d0 + lVar3));
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_3a0.attribLocationBindings,&vStack_240);
    local_3a0.transformFeedbackBufferMode = local_228;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_3a0.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_220);
    local_3a0.separable = local_208;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_4b0._4_4_,local_4b0._0_4_) != &local_4a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_4b0._4_4_,local_4b0._0_4_),
                      local_4a0._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_220);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&vStack_240);
    lVar3 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    break;
  case BUILDERROR_GEOMETRY:
    memset(local_2d0,0,0xac);
    local_220._0_8_ = (pointer)0x0;
    local_220[8] = 0;
    local_220._9_7_ = 0;
    local_220[0x10] = 0;
    stack0xfffffffffffffdf1 = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_460,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
               ,(char *)code);
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,CONCAT44(local_460._4_4_,local_460._0_4_),
               (char *)(local_460._8_8_ + CONCAT44(local_460._4_4_,local_460._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d0,&local_4d0);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_418,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\nlayout(triangles) in;\nlayout(max_vertices=1, points) out;\nin highp vec4 v_missingVar[];\nuniform highp int u_uniform;\nvoid main()\n{\n\tgl_Position = gl_in[0].gl_Position + v_missingVar[2] + vec4(float(u_uniform));\n\tEmitVertex();\n}\n"
               ,(char *)code);
    local_4b0._0_4_ = 2;
    local_4b0._8_8_ = local_4a0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4b0 + 8),local_418._M_dataplus._M_p,
               local_418._M_dataplus._M_p + local_418._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + (ulong)(uint)local_4b0._0_4_ * 0x18),(value_type *)(local_4b0 + 8));
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_438,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(char *)code);
    local_488._0_4_ = 1;
    local_488._8_8_ = local_478._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_488 + 8),local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + (ulong)(uint)local_488._0_4_ * 0x18),(value_type *)(local_488 + 8));
    lVar3 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_3a0.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_2d0 + lVar3));
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_3a0.attribLocationBindings,&vStack_240);
    local_3a0.transformFeedbackBufferMode = local_228;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_3a0.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_220);
    local_3a0.separable = local_208;
    if ((char *)local_488._8_8_ != local_478._M_local_buf + 8) {
      operator_delete((void *)local_488._8_8_,local_478._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_4b0._8_8_ != local_4a0._M_local_buf + 8) {
      operator_delete((void *)local_4b0._8_8_,local_4a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_460._4_4_,local_460._0_4_) != &local_450) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_460._4_4_,local_460._0_4_),
                      local_450._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_220);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&vStack_240);
    lVar3 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    break;
  case BUILDERROR_TESSELLATION:
    memset(local_2d0,0,0xac);
    local_220._0_8_ = (pointer)0x0;
    local_220[8] = 0;
    local_220._9_7_ = 0;
    local_220[0x10] = 0;
    stack0xfffffffffffffdf1 = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_418,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nvoid main()\n{\n\tgl_Position = a_pos;\n}\n"
               ,(char *)code);
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,local_418._M_dataplus._M_p,
               local_418._M_dataplus._M_p + local_418._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d0,&local_4d0);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_438,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=2) out;patch out highp vec2 vp_var;\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position\n\tgl_TessLevelOuter[0] = 0.8;\n\tgl_TessLevelOuter[1] = 0.8;\n\tif (gl_InvocationID == 0)\n\t\tvp_var = gl_in[gl_InvocationID].gl_Position.xy;\n}\n"
               ,(char *)code);
    local_4b0._0_4_ = 3;
    local_4b0._8_8_ = local_4a0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4b0 + 8),local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + (ulong)(uint)local_4b0._0_4_ * 0x18),(value_type *)(local_4b0 + 8));
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_3c0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines) in;in highp float vp_var[];\nvoid main()\n{\n\tgl_Position = gl_in[gl_InvocationID].gl_Position + vec4(vp_var[1]);\n}\n"
               ,(char *)code);
    local_488._0_4_ = 4;
    local_488._8_8_ = local_478._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_488 + 8),local_3c0._0_8_,(char *)(local_3c0._0_8_ + local_3c0._8_8_)
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + (ulong)(uint)local_488._0_4_ * 0x18),(value_type *)(local_488 + 8));
    (anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)&local_3e0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(char *)code);
    local_460._0_4_ = 1;
    local_460._8_8_ = local_450._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_460 + 8),local_3e0._M_allocated_capacity,
               local_3e0._8_8_ + local_3e0._M_allocated_capacity);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + (ulong)(uint)local_460._0_4_ * 0x18),(value_type *)(local_460 + 8));
    lVar3 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_3a0.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar3),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_2d0 + lVar3));
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_3a0.attribLocationBindings,&vStack_240);
    local_3a0.transformFeedbackBufferMode = local_228;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_3a0.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_220);
    local_3a0.separable = local_208;
    if ((char *)local_460._8_8_ != local_450._M_local_buf + 8) {
      operator_delete((void *)local_460._8_8_,local_450._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_allocated_capacity != &local_3d0) {
      operator_delete((void *)local_3e0._M_allocated_capacity,local_3d0._M_allocated_capacity + 1);
    }
    if ((char *)local_488._8_8_ != local_478._M_local_buf + 8) {
      operator_delete((void *)local_488._8_8_,local_478._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._0_8_ != &local_3b0) {
      operator_delete((void *)local_3c0._0_8_,local_3b0._M_allocated_capacity + 1);
    }
    if ((char *)local_4b0._8_8_ != local_4a0._M_local_buf + 8) {
      operator_delete((void *)local_4b0._8_8_,local_4a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_220);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&vStack_240);
    lVar3 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
    break;
  default:
    memset(&local_3a0,0,0xac);
    local_3a0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_3a0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_3a0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_3a0._193_8_ = 0;
  }
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,&local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3a0.attribLocationBindings);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_3a0.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_3a0.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xdededededededede;
  local_3a0.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xdededede;
  local_3f8[0x10] = true;
  local_2d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_2d0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Trying to link a broken program.",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)&local_258);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)local_3f8,local_100.m_program.m_program,0x8b84,
             (GLint *)((long)&local_3a0.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4));
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)&local_3a0,&local_150);
  bVar1 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_3a0,&local_150);
  if (bVar1) {
    verifyInfoLogQuery((Functional *)&local_150,(ResultCollector *)local_3f8,
                       (CallLogWrapper *)
                       ((ulong)local_3a0.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 0x20),
                       local_100.m_program.m_program,0x86b708,0,"glGetProgramInfoLog");
  }
  tcu::ResultCollector::setTestContextResult
            (&local_150,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_message._M_dataplus._M_p != &local_150.m_message.field_2) {
    operator_delete(local_150.m_message._M_dataplus._M_p,
                    local_150.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.m_prefix._M_dataplus._M_p != &local_150.m_prefix.field_2) {
    operator_delete(local_150.m_prefix._M_dataplus._M_p,
                    local_150.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

ProgramLogCase::IterateResult ProgramLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result		(m_testCtx.getLog());
	glu::CallLogWrapper						gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram						program		(m_context.getRenderContext(), getProgramSources());
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to link a broken program." << tcu::TestLog::EndMessage;

	gl.glGetProgramiv(program.getProgram(), GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (logLen.verifyValidity(result))
		verifyInfoLogQuery(result, gl, logLen, program.getProgram(), &glu::CallLogWrapper::glGetProgramInfoLog, "glGetProgramInfoLog");

	result.setTestContextResult(m_testCtx);
	return STOP;
}